

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void __thiscall ExampleAppDocuments::ExampleAppDocuments(ExampleAppDocuments *this)

{
  ImVec4 local_140;
  MyDocument local_130;
  ImVec4 local_110;
  MyDocument local_100;
  ImVec4 local_e0;
  MyDocument local_d0;
  ImVec4 local_b0;
  MyDocument local_a0;
  ImVec4 local_80;
  MyDocument local_70;
  ImVec4 local_40;
  MyDocument local_30;
  ExampleAppDocuments *local_10;
  ExampleAppDocuments *this_local;
  
  local_10 = this;
  ImVector<MyDocument>::ImVector(&this->Documents);
  ImVec4::ImVec4(&local_40,0.4,0.8,0.4,1.0);
  MyDocument::MyDocument(&local_30,"Lettuce",true,&local_40);
  ImVector<MyDocument>::push_back(&this->Documents,&local_30);
  ImVec4::ImVec4(&local_80,0.8,0.5,1.0,1.0);
  MyDocument::MyDocument(&local_70,"Eggplant",true,&local_80);
  ImVector<MyDocument>::push_back(&this->Documents,&local_70);
  ImVec4::ImVec4(&local_b0,1.0,0.8,0.5,1.0);
  MyDocument::MyDocument(&local_a0,"Carrot",true,&local_b0);
  ImVector<MyDocument>::push_back(&this->Documents,&local_a0);
  ImVec4::ImVec4(&local_e0,1.0,0.3,0.4,1.0);
  MyDocument::MyDocument(&local_d0,"Tomato",false,&local_e0);
  ImVector<MyDocument>::push_back(&this->Documents,&local_d0);
  ImVec4::ImVec4(&local_110,1.0,1.0,1.0,1.0);
  MyDocument::MyDocument(&local_100,"A Rather Long Title",false,&local_110);
  ImVector<MyDocument>::push_back(&this->Documents,&local_100);
  ImVec4::ImVec4(&local_140,1.0,1.0,1.0,1.0);
  MyDocument::MyDocument(&local_130,"Some Document",false,&local_140);
  ImVector<MyDocument>::push_back(&this->Documents,&local_130);
  return;
}

Assistant:

ExampleAppDocuments()
    {
        Documents.push_back(MyDocument("Lettuce",             true,  ImVec4(0.4f, 0.8f, 0.4f, 1.0f)));
        Documents.push_back(MyDocument("Eggplant",            true,  ImVec4(0.8f, 0.5f, 1.0f, 1.0f)));
        Documents.push_back(MyDocument("Carrot",              true,  ImVec4(1.0f, 0.8f, 0.5f, 1.0f)));
        Documents.push_back(MyDocument("Tomato",              false, ImVec4(1.0f, 0.3f, 0.4f, 1.0f)));
        Documents.push_back(MyDocument("A Rather Long Title", false));
        Documents.push_back(MyDocument("Some Document",       false));
    }